

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

void __thiscall TTD::EventLog::DoRtrSnapIfNeeded(EventLog *this)

{
  TTEventListLink *pTVar1;
  ulong uVar2;
  bool bVar3;
  EventLogEntry *pEVar4;
  SnapShot *pSVar5;
  undefined1 auStack_58 [8];
  BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  liveTopLevelBodies;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pTVar1 = (this->m_currentReplayEventIterator).m_currLink;
  if (((pTVar1 != (TTEventListLink *)0x0) &&
      (uVar2 = (this->m_currentReplayEventIterator).m_currIdx, pTVar1->StartPos <= uVar2)) &&
     (uVar2 < pTVar1->CurrPos)) {
    pEVar4 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator);
    bVar3 = NSLogEvents::IsJsRTActionRootCall(pEVar4);
    if (bVar3) {
      SetSnapshotOrInflateInProgress(this,true);
      TTModeStack::Push(&this->m_modeStack,ExcludedExecutionTTAction);
      UpdateComputedMode(this);
      pEVar4 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator);
      if (pEVar4->EventKind == CallExistingFunctionActionTag) {
        if (*(long *)pEVar4[3].EventTimeStamp == 0) {
          AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                    ((AutoNestedHandledExceptionType *)
                     ((long)&liveTopLevelBodies.
                             super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             .stats + 4),ExceptionType_JavascriptException|ExceptionType_OutOfMemory
                    );
          auStack_58 = (undefined1  [8])0x0;
          liveTopLevelBodies.
          super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          .buckets = (Type)0x0;
          liveTopLevelBodies.
          super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          .entries = (Type)&Memory::HeapAllocator::Instance;
          liveTopLevelBodies.
          super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          .alloc = (Type)0x0;
          liveTopLevelBodies.
          super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          .size = 0;
          liveTopLevelBodies.
          super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          .count = 0;
          liveTopLevelBodies.
          super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          .freeList = 0x4b;
          liveTopLevelBodies.
          super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          .freeCount = 0;
          liveTopLevelBodies.
          super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          .modFunctionIndex = 0;
          pSVar5 = DoSnapshotExtract_Helper
                             (this,0.0,(BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                        *)auStack_58);
          *(SnapShot **)pEVar4[3].EventTimeStamp = pSVar5;
          JsUtil::
          BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::~BaseDictionary((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             *)auStack_58);
          AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                    ((AutoNestedHandledExceptionType *)
                     ((long)&liveTopLevelBodies.
                             super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             .stats + 4));
        }
        PopMode(this,ExcludedExecutionTTAction);
        SetSnapshotOrInflateInProgress(this,false);
        return;
      }
      TTDAbort_unrecoverable_error("Bad tag match!");
    }
  }
  TTDAbort_unrecoverable_error("Something in wrong with the event position.");
}

Assistant:

void EventLog::DoRtrSnapIfNeeded()
    {
        TTDAssert(this->m_currentReplayEventIterator.IsValid() && NSLogEvents::IsJsRTActionRootCall(this->m_currentReplayEventIterator.Current()), "Something in wrong with the event position.");

        this->SetSnapshotOrInflateInProgress(true);
        this->PushMode(TTDMode::ExcludedExecutionTTAction);

        NSLogEvents::JsRTCallFunctionAction* rootCall = NSLogEvents::GetInlineEventDataAs<NSLogEvents::JsRTCallFunctionAction, NSLogEvents::EventKind::CallExistingFunctionActionTag>(this->m_currentReplayEventIterator.Current());
        if(rootCall->AdditionalReplayInfo->RtRSnap == nullptr)
        {
            //Be careful to ensure that caller is actually doing this
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_JavascriptException));

            JsUtil::BaseHashSet<Js::FunctionBody*, HeapAllocator> liveTopLevelBodies(&HeapAllocator::Instance); //don't actually care about the result here
            rootCall->AdditionalReplayInfo->RtRSnap = this->DoSnapshotExtract_Helper(0.0, liveTopLevelBodies);
        }

        this->PopMode(TTDMode::ExcludedExecutionTTAction);
        this->SetSnapshotOrInflateInProgress(false);
    }